

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall
ON_Font::SetFromFontDescription(ON_Font *this,wchar_t *font_description,wchar_t *postscript_name)

{
  Stretch SVar1;
  bool bVar2;
  Stretch SVar3;
  int iVar4;
  int i;
  uint uVar5;
  uint uVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  Stretch SVar9;
  Stretch font_stretch;
  wchar_t *s0_1;
  size_t string_length;
  undefined8 in_R8;
  wchar_t *s0;
  double linefeed_ratio;
  Weight local_83;
  Style local_82;
  ON_wString local_face_name;
  wchar_t *s1;
  ON_wString local_postscript_name;
  ON_wString local_font_description;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  ON_wString::ON_wString(&local_font_description,font_description);
  ON_wString::TrimLeftAndRight(&local_font_description,(wchar_t *)0x0);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_font_description);
  ON_wString::ON_wString(&local_postscript_name,postscript_name);
  ON_wString::TrimLeftAndRight(&local_postscript_name,(wchar_t *)0x0);
  ON_wString::operator_cast_to_wchar_t_(&local_postscript_name);
  if ((pwVar7 == (wchar_t *)0x0) || (*pwVar7 < L'!')) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_postscript_name);
    ON_wString::operator=(&local_font_description,&local_postscript_name);
    if ((pwVar7 == (wchar_t *)0x0) || (*pwVar7 < L'!')) {
      bVar2 = false;
LAB_004a0dc3:
      ON_wString::~ON_wString(&local_postscript_name);
      ON_wString::~ON_wString(&local_font_description);
      return bVar2;
    }
  }
  ON_wString::ON_wString(&local_face_name,pwVar7);
  iVar4 = ON_wString::Length(&local_face_name);
  i = ON_wString::Length(L"Times New Roman");
  if ((i <= iVar4) &&
     ((iVar4 <= i || (pwVar8 = ON_wString::operator[](&local_face_name,i), *pwVar8 < L'!')))) {
    in_R8 = 1;
    bVar2 = ON_wString::EqualOrdinal(L"Times New Roman",i,pwVar7,i,true);
    if ((bVar2) &&
       (pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_face_name), pwVar7 != (wchar_t *)0x0))
    {
      pwVar7 = pwVar7 + i;
      goto LAB_004a0a7b;
    }
  }
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
  pwVar7 = pwVar7 + 1;
LAB_004a0a7b:
  local_83 = Default.m_font_weight;
  pwVar8 = pwVar7;
LAB_004a0a9d:
  if (*pwVar8 == L'\0') goto LAB_004a0bc2;
  bVar2 = IsAtoZ(pwVar8);
  if (bVar2) {
    s1 = pwVar8;
    uVar5 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_251df9_00821970,(uint *)&DAT_006a80d0,
                       (uint)in_R8);
    local_50 = 4;
    local_48 = 3;
    if (uVar5 != 0) {
      local_50 = 0;
      if (((s1 != (wchar_t *)0x0) && ((uint)(*s1 + L'\xffffffe0') < 0x40)) &&
         ((0x8000000008007001U >> ((ulong)(uint)(*s1 + L'\xffffffe0') & 0x3f) & 1) != 0)) {
        s1 = s1 + 1;
      }
      local_48 = 0;
    }
    local_58 = (wchar_t *)0x200000001;
    local_44 = 0x600000005;
    local_3c = 6;
    local_4c = local_50;
    uVar6 = ParseToken(&s1,8,(wchar_t **)&PTR_anon_var_dwarf_251e29_00821910,(uint *)&local_58,
                       (uint)in_R8);
    switch(uVar6) {
    case 1:
      local_83 = Thin;
      goto LAB_004a0bb0;
    case 2:
      if (uVar5 < 3) {
        local_83 = Ultralight;
LAB_004a0bb0:
        for (; pwVar8 < s1; pwVar8 = pwVar8 + 1) {
          *pwVar8 = L'\x01';
        }
LAB_004a0bc2:
        local_82 = Default.m_font_style;
        pwVar8 = pwVar7;
        do {
          if (*pwVar8 == L'\0') goto LAB_004a0c39;
          bVar2 = IsAtoZ(pwVar8);
          if (bVar2) {
            local_58 = pwVar8;
            uVar5 = ParseToken((wchar_t **)&local_58,4,
                               (wchar_t **)&PTR_anon_var_dwarf_251e89_00821950,(uint *)&DAT_006a80e0
                               ,(uint)in_R8);
            if (uVar5 - 1 < 3) {
              local_82 = (char)(uVar5 - 1) + Upright;
              for (; pwVar8 < local_58; pwVar8 = pwVar8 + 1) {
                *pwVar8 = L'\x01';
              }
LAB_004a0c39:
              font_stretch = Default.m_font_stretch;
              for (; *pwVar7 != L'\0'; pwVar7 = pwVar7 + 1) {
                bVar2 = IsAtoZ(pwVar7);
                if (!bVar2) goto switchD_004a0e01_default;
                s1 = pwVar7;
                uVar5 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_251df9_00821970,
                                   (uint *)&DAT_006a80e0,(uint)in_R8);
                local_50 = 2;
                if (((uVar5 != 0) && (local_50 = 0, s1 != (wchar_t *)0x0)) &&
                   (((uint)(*s1 + L'\xffffffe0') < 0x40 &&
                    ((0x8000000008007001U >> ((ulong)(uint)(*s1 + L'\xffffffe0') & 0x3f) & 1) != 0))
                   )) {
                  s1 = s1 + 1;
                }
                local_58 = (wchar_t *)CONCAT44(local_50,1);
                local_4c = 3;
                uVar6 = ParseToken(&s1,4,(wchar_t **)&PTR_anon_var_dwarf_251eb9_00821990,
                                   (uint *)&local_58,(uint)in_R8);
                if (uVar6 == 3) {
                  SVar3 = Ultraexpanded;
                  SVar9 = Semiexpanded;
                  SVar1 = Extraexpanded;
                  switch(uVar5) {
                  case 0:
                    SVar1 = Expanded;
                    break;
                  case 1:
switchD_004a0e01_caseD_1:
                    SVar1 = SVar9;
                    break;
                  case 2:
                    break;
                  case 3:
switchD_004a0e01_caseD_3:
                    SVar1 = SVar3;
                    break;
                  default:
                    goto switchD_004a0e01_default;
                  }
                  goto switchD_004a0e01_caseD_2;
                }
                if (uVar6 == 2) {
                  if (uVar5 == 0) {
                    SVar1 = Medium;
                    goto switchD_004a0e01_caseD_2;
                  }
                }
                else if (uVar6 == 1) {
                  SVar3 = Ultracondensed;
                  SVar9 = Semicondensed;
                  SVar1 = Extracondensed;
                  switch(uVar5) {
                  case 0:
                    SVar1 = Condensed;
                  case 2:
switchD_004a0e01_caseD_2:
                    font_stretch = SVar1;
                    for (; pwVar7 < s1; pwVar7 = pwVar7 + 1) {
                      *pwVar7 = L'\x01';
                    }
                    break;
                  case 1:
                    goto switchD_004a0e01_caseD_1;
                  case 3:
                    goto switchD_004a0e01_caseD_3;
                  default:
                    goto switchD_004a0e01_default;
                  }
                  break;
                }
switchD_004a0e01_default:
              }
              pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
              for (string_length = 0; L'\x1f' < pwVar7[string_length];
                  string_length = string_length + 1) {
              }
              ON_wString::SetLength(&local_face_name,string_length);
              ON_wString::TrimLeftAndRight(&local_face_name,(wchar_t *)0x0);
              pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_face_name);
              bVar2 = SetFontCharacteristics
                                (this,pwVar7,local_83,local_82,font_stretch,false,false,
                                 linefeed_ratio,1);
              if (bVar2) {
                ON_wString::operator=(&this->m_loc_postscript_name,&local_postscript_name);
                ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
              }
              ON_wString::~ON_wString(&local_face_name);
              goto LAB_004a0dc3;
            }
          }
          pwVar8 = pwVar8 + 1;
        } while( true );
      }
      break;
    case 3:
      local_83 = Normal;
      goto LAB_004a0bb0;
    case 4:
      local_83 = Medium;
      goto LAB_004a0bb0;
    case 5:
      if (uVar5 < 3) {
        local_83 = Ultrabold;
        goto LAB_004a0bb0;
      }
      break;
    case 6:
      local_83 = Heavy;
      goto LAB_004a0bb0;
    }
  }
  pwVar8 = pwVar8 + 1;
  goto LAB_004a0a9d;
}

Assistant:

bool ON_Font::SetFromFontDescription(
  const wchar_t* font_description,
  const wchar_t* postscript_name
  )
{
  ON_wString local_font_description(font_description);
  local_font_description.TrimLeftAndRight();
  font_description = static_cast<const wchar_t*>(local_font_description);

  ON_wString local_postscript_name(postscript_name);
  local_postscript_name.TrimLeftAndRight();
  postscript_name = static_cast<const wchar_t*>(local_postscript_name);

  if (nullptr == font_description || font_description[0] <= ON_wString::Space)
  {
    font_description = local_postscript_name;
    local_font_description = local_postscript_name;
    if (nullptr == font_description || font_description[0] <= ON_wString::Space)
      return false;
  }

  // As names are discovered that do not work in the code below,
  // add a special case here.  These are typically fonts that have
  // words like Upright, Italic, Oblique, Regular, Semi, Demi, Extra, Ultra, Medium
  // Black, Heavy, ... as part of the face name and those words must not
  // be parsed as possible weight, style or stretch characteristics applied
  // to a root face name.
  const wchar_t* special_cases[] = {
    // Apple's "Times New Roman" and "Times New Roman Bold Italic" is an example of why
    // special cases are required.  The face name is "Times New Roman" and "Roman" no
    // longer indicates an upright style.
    // However, Apple's "Avenir Roman" and "Avenir Oblique" fonts provide an example
    // where "Roman" is style and "Avenir" is a face name.  The default parsing
    // handles Avenir and any other font names that are using Roman as a style.
    L"Times New Roman", 

    // Put new special case names above this nullptr which terminates the special_cases[] list.
    nullptr
  };

  // NOTE WELL: 
  //  It is important that local_face_name be created from a pointer
  //  so that it's string buffer is not shared with other ON_wStrings.
  //  wchar_t values in local_face_name are modifed via const_cast<> below.
  ON_wString local_face_name = static_cast<const wchar_t*>(font_description);
  const wchar_t* characteristics = nullptr;
  int face_name_length = local_face_name.Length();
  for (int i = 0; nullptr != special_cases[i]; i++)
  {
    const int special_case_length = ON_wString::Length(special_cases[i]);
    if (special_case_length > face_name_length)
      continue;
    
    if (special_case_length < face_name_length && local_face_name[special_case_length] > ON_wString::Space )
      continue;
    
    if (false == ON_wString::EqualOrdinal(special_cases[i], special_case_length, font_description, special_case_length, true))
      continue;

    characteristics = static_cast<const wchar_t*>(local_face_name) + special_case_length;
    break;
  }

  if (nullptr == characteristics)
    characteristics = static_cast<const wchar_t*>(local_face_name) + 1;

  const wchar_t x = (wchar_t)1;

  ON_Font::Weight font_weight = ON_Font::Default.m_font_weight;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseWeight(s1, font_weight))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Style font_style = ON_Font::Default.m_font_style;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStyle(s1, font_style))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Stretch font_stretch = ON_Font::Default.m_font_stretch;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStretch(s1, font_stretch))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  face_name_length = 0;
  for (const wchar_t* s = static_cast<const wchar_t*>(local_face_name); 0 != *s; s++)
  {
    if (*s >= ON_wString::Space)
      face_name_length++;
    else
    {
      while (*s > 0 && *s <= ON_wString::Space)
        s++;
      break;
    }
  }
  local_face_name.SetLength(face_name_length);
  local_face_name.TrimLeftAndRight();
  const wchar_t* face_name = static_cast<const wchar_t*>(local_face_name);

  bool rc = SetFontCharacteristics(
    face_name,
    font_weight,
    font_style,
    font_stretch,
    false,
    false,
    ON_FontMetrics::DefaultLineFeedRatio,
    ON_Font::WindowsConstants::logfont_default_charset
    );

  if (rc)
  {
    m_loc_postscript_name = local_postscript_name;
    m_en_postscript_name = m_loc_postscript_name;
  }  

  return rc;
}